

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  bool bVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int32_t iVar23;
  fpclass_type fVar24;
  int32_t iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  undefined4 in_register_0000000c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  uint uVar30;
  long lVar31;
  fpclass_type *pfVar32;
  uint uVar33;
  undefined4 in_register_00000084;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  cpp_dec_float<50U,_int,_void> local_388;
  undefined8 local_350;
  undefined8 local_348;
  long local_340;
  IdxElement local_338;
  IdxElement local_2fc;
  IdxElement local_2c0;
  IdxElement local_284;
  IdxElement local_248;
  IdxElement local_20c;
  type t;
  IdxElement local_198;
  IdxElement local_15c;
  IdxElement local_120;
  IdxElement local_e4;
  IdxElement local_a8;
  IdxElement local_6c;
  
  local_348 = CONCAT44(in_register_00000084,size);
  local_350 = CONCAT44(in_register_0000000c,end);
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  uVar30 = end - 1;
  if ((int)uVar30 <= start2 + size) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,end,compare,start2,type);
    return uVar30;
  }
  iVar28 = (int)(start2 + uVar30) / 2;
  pIVar1 = keys + iVar28;
  pIVar2 = keys + iVar28;
  pnVar29 = &pIVar2->val;
  iVar28 = pIVar2->idx;
  uVar10 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
  uVar12 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
  uVar13 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
  uVar14 = *(undefined8 *)(pnVar29->m_backend).data._M_elems;
  uVar15 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
  iVar35 = (pIVar2->val).m_backend.exp;
  bVar5 = (pIVar2->val).m_backend.neg;
  fVar7 = (pIVar2->val).m_backend.fpclass;
  iVar8 = (pIVar2->val).m_backend.prec_elem;
  local_340 = -(long)(int)uVar30;
  lVar27 = (long)start2;
  uVar34 = uVar30;
  uVar33 = start2;
  do {
    uVar36 = (ulong)uVar34;
    if (type) {
      if ((int)uVar33 < (int)uVar30) {
        pfVar32 = &keys[(int)uVar33].val.m_backend.fpclass;
        lVar37 = (int)uVar33 + local_340;
        lVar31 = 0;
        do {
          local_6c.idx = pfVar32[-0xd];
          local_6c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar32 + -4);
          local_6c.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar32 + -0xc))->data)._M_elems;
          local_6c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar32 + -10);
          local_6c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar32 + -8);
          local_6c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar32 + -6);
          local_6c.val.m_backend.exp = pfVar32[-2];
          local_6c.val.m_backend.neg = *(bool *)(pfVar32 + -1);
          local_6c.val.m_backend._48_8_ = *(undefined8 *)pfVar32;
          local_20c.idx = iVar28;
          local_20c.val.m_backend.data._M_elems._0_8_ = uVar14;
          local_20c.val.m_backend.data._M_elems._8_8_ = uVar15;
          local_20c.val.m_backend.data._M_elems._16_8_ = uVar12;
          local_20c.val.m_backend.data._M_elems._24_8_ = uVar13;
          local_20c.val.m_backend.data._M_elems._32_8_ = uVar10;
          local_20c.val.m_backend.exp = iVar35;
          local_20c.val.m_backend.neg = bVar5;
          local_20c.val.m_backend.fpclass = fVar7;
          local_20c.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_6c,&local_20c);
          if (local_388.fpclass == cpp_dec_float_NaN) {
            uVar33 = uVar33 - (int)lVar31;
            goto LAB_002bd0ee;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (-1 < iVar26) {
            uVar33 = uVar33 - (int)lVar31;
            goto LAB_002bd0ee;
          }
          lVar31 = lVar31 + -1;
          pfVar32 = pfVar32 + 0xf;
        } while (lVar37 != lVar31);
        uVar33 = uVar33 - (int)lVar31;
      }
LAB_002bd0ee:
      if (start2 < (int)uVar34) {
        uVar36 = (ulong)(int)uVar34;
        pfVar32 = &keys[uVar36].val.m_backend.fpclass;
        do {
          local_a8.idx = pfVar32[-0xd];
          local_a8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar32 + -4);
          local_a8.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar32 + -0xc))->data)._M_elems;
          local_a8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar32 + -10);
          local_a8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar32 + -8);
          local_a8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar32 + -6);
          local_a8.val.m_backend.exp = pfVar32[-2];
          local_a8.val.m_backend.neg = *(bool *)(pfVar32 + -1);
          local_a8.val.m_backend._48_8_ = *(undefined8 *)pfVar32;
          local_248.idx = iVar28;
          local_248.val.m_backend.data._M_elems._0_8_ = uVar14;
          local_248.val.m_backend.data._M_elems._8_8_ = uVar15;
          local_248.val.m_backend.data._M_elems._16_8_ = uVar12;
          local_248.val.m_backend.data._M_elems._24_8_ = uVar13;
          local_248.val.m_backend.data._M_elems._32_8_ = uVar10;
          local_248.val.m_backend.exp = iVar35;
          local_248.val.m_backend.neg = bVar5;
          local_248.val.m_backend.fpclass = fVar7;
          local_248.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_a8,&local_248);
          if (local_388.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (iVar26 < 0) break;
          uVar36 = uVar36 - 1;
          pfVar32 = pfVar32 + -0xf;
        } while (lVar27 < (long)uVar36);
      }
    }
    else {
      if ((int)uVar33 < (int)uVar30) {
        pfVar32 = &keys[(int)uVar33].val.m_backend.fpclass;
        do {
          local_e4.idx = pfVar32[-0xd];
          local_e4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar32 + -4);
          local_e4.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar32 + -0xc))->data)._M_elems;
          local_e4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar32 + -10);
          local_e4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar32 + -8);
          local_e4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar32 + -6);
          local_e4.val.m_backend.exp = pfVar32[-2];
          local_e4.val.m_backend.neg = *(bool *)(pfVar32 + -1);
          local_e4.val.m_backend._48_8_ = *(undefined8 *)pfVar32;
          local_284.idx = iVar28;
          local_284.val.m_backend.data._M_elems._0_8_ = uVar14;
          local_284.val.m_backend.data._M_elems._8_8_ = uVar15;
          local_284.val.m_backend.data._M_elems._16_8_ = uVar12;
          local_284.val.m_backend.data._M_elems._24_8_ = uVar13;
          local_284.val.m_backend.data._M_elems._32_8_ = uVar10;
          local_284.val.m_backend.exp = iVar35;
          local_284.val.m_backend.neg = bVar5;
          local_284.val.m_backend.fpclass = fVar7;
          local_284.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_e4,&local_284);
          if (local_388.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (0 < iVar26) break;
          uVar33 = uVar33 + 1;
          pfVar32 = pfVar32 + 0xf;
        } while (uVar30 != uVar33);
      }
      if (start2 < (int)uVar34) {
        uVar36 = (ulong)(int)uVar34;
        pfVar32 = &keys[uVar36].val.m_backend.fpclass;
        do {
          local_120.idx = pfVar32[-0xd];
          local_120.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar32 + -4);
          local_120.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar32 + -0xc))->data)._M_elems;
          local_120.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar32 + -10);
          local_120.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar32 + -8);
          local_120.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar32 + -6);
          local_120.val.m_backend.exp = pfVar32[-2];
          local_120.val.m_backend.neg = *(bool *)(pfVar32 + -1);
          local_120.val.m_backend._48_8_ = *(undefined8 *)pfVar32;
          local_2c0.idx = iVar28;
          local_2c0.val.m_backend.data._M_elems._0_8_ = uVar14;
          local_2c0.val.m_backend.data._M_elems._8_8_ = uVar15;
          local_2c0.val.m_backend.data._M_elems._16_8_ = uVar12;
          local_2c0.val.m_backend.data._M_elems._24_8_ = uVar13;
          local_2c0.val.m_backend.data._M_elems._32_8_ = uVar10;
          local_2c0.val.m_backend.exp = iVar35;
          local_2c0.val.m_backend.neg = bVar5;
          local_2c0.val.m_backend.fpclass = fVar7;
          local_2c0.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_120,&local_2c0);
          if (local_388.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (iVar26 < 1) break;
          uVar36 = uVar36 - 1;
          pfVar32 = pfVar32 + -0xf;
        } while (lVar27 < (long)uVar36);
      }
    }
    uVar34 = (uint)uVar36;
    if ((int)uVar34 <= (int)uVar33) break;
    iVar26 = keys[(int)uVar33].idx;
    uVar11 = *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 8);
    puVar3 = keys[(int)uVar33].val.m_backend.data._M_elems + 4;
    uVar16 = *(undefined8 *)puVar3;
    uVar17 = *(undefined8 *)(puVar3 + 2);
    uVar18 = *(undefined8 *)keys[(int)uVar33].val.m_backend.data._M_elems;
    uVar19 = *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 2);
    iVar9 = keys[(int)uVar33].val.m_backend.exp;
    bVar6 = keys[(int)uVar33].val.m_backend.neg;
    keys[(int)uVar33].idx = keys[(int)uVar34].idx;
    *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 8) =
         *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 8);
    uVar20 = *(undefined8 *)keys[(int)uVar34].val.m_backend.data._M_elems;
    uVar21 = *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 2);
    puVar3 = keys[(int)uVar34].val.m_backend.data._M_elems + 4;
    uVar22 = *(undefined8 *)(puVar3 + 2);
    puVar4 = keys[(int)uVar33].val.m_backend.data._M_elems + 4;
    *(undefined8 *)puVar4 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar4 + 2) = uVar22;
    *(undefined8 *)keys[(int)uVar33].val.m_backend.data._M_elems = uVar20;
    *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 2) = uVar21;
    keys[(int)uVar33].val.m_backend.exp = keys[(int)uVar34].val.m_backend.exp;
    keys[(int)uVar33].val.m_backend.neg = keys[(int)uVar34].val.m_backend.neg;
    keys[(int)uVar34].idx = iVar26;
    *(undefined8 *)keys[(int)uVar34].val.m_backend.data._M_elems = uVar18;
    *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 2) = uVar19;
    puVar3 = keys[(int)uVar34].val.m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar16;
    *(undefined8 *)(puVar3 + 2) = uVar17;
    *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 8) = uVar11;
    keys[(int)uVar34].val.m_backend.exp = iVar9;
    keys[(int)uVar34].val.m_backend.neg = bVar6;
    fVar24 = keys[(int)uVar33].val.m_backend.fpclass;
    iVar25 = keys[(int)uVar33].val.m_backend.prec_elem;
    iVar23 = keys[(int)uVar34].val.m_backend.prec_elem;
    keys[(int)uVar33].val.m_backend.fpclass = keys[(int)uVar34].val.m_backend.fpclass;
    keys[(int)uVar33].val.m_backend.prec_elem = iVar23;
    keys[(int)uVar34].val.m_backend.fpclass = fVar24;
    keys[(int)uVar34].val.m_backend.prec_elem = iVar25;
    uVar33 = uVar33 + 1;
    uVar34 = uVar34 - 1;
  } while( true );
  if (type) {
    if ((int)uVar33 < (int)uVar30) {
      pfVar32 = &keys[(int)uVar33].val.m_backend.fpclass;
      do {
        local_15c.idx = pfVar32[-0xd];
        local_15c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar32 + -4);
        local_15c.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar32 + -0xc))->data)._M_elems;
        local_15c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar32 + -10);
        local_15c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar32 + -8);
        local_15c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar32 + -6);
        local_15c.val.m_backend.exp = pfVar32[-2];
        local_15c.val.m_backend.neg = *(bool *)(pfVar32 + -1);
        local_15c.val.m_backend._48_8_ = *(undefined8 *)pfVar32;
        local_2fc.idx = iVar28;
        local_2fc.val.m_backend.data._M_elems._0_8_ = uVar14;
        local_2fc.val.m_backend.data._M_elems._8_8_ = uVar15;
        local_2fc.val.m_backend.data._M_elems._16_8_ = uVar12;
        local_2fc.val.m_backend.data._M_elems._24_8_ = uVar13;
        local_2fc.val.m_backend.data._M_elems._32_8_ = uVar10;
        local_2fc.val.m_backend.exp = iVar35;
        local_2fc.val.m_backend.neg = bVar5;
        local_2fc.val.m_backend.fpclass = fVar7;
        local_2fc.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_388,compare,&local_2fc,&local_15c);
        if (local_388.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_388,&t.m_backend);
        if (iVar26 < 0) break;
        uVar33 = uVar33 + 1;
        pfVar32 = pfVar32 + 0xf;
      } while (uVar30 != uVar33);
    }
    if (uVar33 == start2) {
      iVar28 = keys[(int)uVar33].idx;
      uVar10 = *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 8);
      puVar3 = keys[(int)uVar33].val.m_backend.data._M_elems + 4;
      uVar12 = *(undefined8 *)puVar3;
      uVar13 = *(undefined8 *)(puVar3 + 2);
      uVar14 = *(undefined8 *)keys[(int)uVar33].val.m_backend.data._M_elems;
      uVar15 = *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 2);
      iVar35 = keys[(int)uVar33].val.m_backend.exp;
      bVar5 = keys[(int)uVar33].val.m_backend.neg;
      keys[(int)uVar33].idx = pIVar1->idx;
      *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar11 = *(undefined8 *)(pnVar29->m_backend).data._M_elems;
      uVar16 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[(int)uVar33].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar17;
      *(undefined8 *)keys[(int)uVar33].val.m_backend.data._M_elems = uVar11;
      *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 2) = uVar16;
      keys[(int)uVar33].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar33].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar28;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar10;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar12;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar13;
      *(undefined8 *)(pnVar29->m_backend).data._M_elems = uVar14;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar15;
      (pIVar1->val).m_backend.exp = iVar35;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar7 = keys[(int)uVar33].val.m_backend.fpclass;
      iVar23 = keys[(int)uVar33].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar33].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar33].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar23;
      uVar33 = uVar33 + 1;
    }
  }
  else {
    if (start2 < (int)uVar34) {
      uVar36 = (ulong)(int)uVar34;
      pfVar32 = &keys[uVar36].val.m_backend.fpclass;
      do {
        local_198.idx = pfVar32[-0xd];
        local_198.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar32 + -4);
        local_198.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar32 + -0xc))->data)._M_elems;
        local_198.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar32 + -10);
        local_198.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar32 + -8);
        local_198.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar32 + -6);
        local_198.val.m_backend.exp = pfVar32[-2];
        local_198.val.m_backend.neg = *(bool *)(pfVar32 + -1);
        local_198.val.m_backend._48_8_ = *(undefined8 *)pfVar32;
        local_338.idx = iVar28;
        local_338.val.m_backend.data._M_elems._0_8_ = uVar14;
        local_338.val.m_backend.data._M_elems._8_8_ = uVar15;
        local_338.val.m_backend.data._M_elems._16_8_ = uVar12;
        local_338.val.m_backend.data._M_elems._24_8_ = uVar13;
        local_338.val.m_backend.data._M_elems._32_8_ = uVar10;
        local_338.val.m_backend.exp = iVar35;
        local_338.val.m_backend.neg = bVar5;
        local_338.val.m_backend.fpclass = fVar7;
        local_338.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_388,compare,&local_338,&local_198);
        if (local_388.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_388,&t.m_backend);
        if (0 < iVar26) break;
        uVar36 = uVar36 - 1;
        pfVar32 = pfVar32 + -0xf;
      } while (lVar27 < (long)uVar36);
    }
    uVar34 = (uint)uVar36;
    if (uVar34 == uVar30) {
      iVar28 = keys[(int)uVar34].idx;
      uVar10 = *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 8);
      puVar3 = keys[(int)uVar34].val.m_backend.data._M_elems + 4;
      uVar12 = *(undefined8 *)puVar3;
      uVar13 = *(undefined8 *)(puVar3 + 2);
      uVar14 = *(undefined8 *)keys[(int)uVar34].val.m_backend.data._M_elems;
      uVar15 = *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 2);
      iVar35 = keys[(int)uVar34].val.m_backend.exp;
      bVar5 = keys[(int)uVar34].val.m_backend.neg;
      keys[(int)uVar34].idx = pIVar1->idx;
      *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar11 = *(undefined8 *)(pnVar29->m_backend).data._M_elems;
      uVar16 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[(int)uVar34].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar17;
      *(undefined8 *)keys[(int)uVar34].val.m_backend.data._M_elems = uVar11;
      *(undefined8 *)(keys[(int)uVar34].val.m_backend.data._M_elems + 2) = uVar16;
      keys[(int)uVar34].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar34].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar28;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar10;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar12;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar13;
      *(undefined8 *)(pnVar29->m_backend).data._M_elems = uVar14;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar15;
      (pIVar1->val).m_backend.exp = iVar35;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar7 = keys[(int)uVar34].val.m_backend.fpclass;
      iVar23 = keys[(int)uVar34].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar34].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar34].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar23;
      uVar34 = uVar34 - 1;
    }
  }
  iVar28 = (int)local_348;
  if ((int)(uVar34 - start2) < iVar28 * 2) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,uVar34 + 1,compare,start2,!type);
    if (iVar28 <= (int)(uVar33 - start2)) {
      return uVar33 - 1;
    }
    iVar28 = (start2 + size) - uVar33;
    iVar35 = (int)local_350;
    start2 = uVar33;
  }
  else {
    iVar35 = uVar34 + 1;
  }
  iVar28 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,compare,start,iVar35,iVar28,start2,end2,!type);
  return iVar28;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}